

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Array.h
# Opt level: O2

bool __thiscall
axl::sl::Array<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>::
reserve(Array<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_> *this,
       size_t count)

{
  FreeFunc *pFVar1;
  size_t sVar2;
  Hdr *pHVar3;
  Ret *pRVar4;
  Hdr *pHVar5;
  Hdr *pHVar6;
  bool bVar7;
  Ptr<axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>::Hdr> hdr;
  Ptr<axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>::Hdr> local_28;
  
  pHVar6 = (this->
           super_ArrayRef<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>
           ).m_hdr;
  if (((pHVar6 == (Hdr *)0x0) || ((pHVar6->super_BufHdr).super_RefCount.m_refCount != 1)) ||
     (bVar7 = true, (pHVar6->super_BufHdr).m_bufferSize < count << 4)) {
    sVar2 = getAllocSize<4096ul>(count << 4);
    pHVar3 = (Hdr *)mem::allocate(sVar2 + 0x30);
    (pHVar3->super_BufHdr).super_RefCount.m_refCount = 0;
    (pHVar3->super_BufHdr).super_RefCount.m_weakRefCount = 1;
    (pHVar3->super_BufHdr).m_bufferSize = sVar2;
    (pHVar3->super_BufHdr).m_flags = 0;
    (pHVar3->super_BufHdr).super_RefCount._vptr_RefCount = (_func_int **)&PTR__Hdr_001990b8;
    (pHVar3->super_BufHdr).super_RefCount.m_freeFunc = mem::deallocate;
    rc::Ptr<axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>::Hdr>::
    Ptr<axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>::Hdr>(&local_28,pHVar3);
    bVar7 = local_28.m_p != (Hdr *)0x0;
    if (bVar7) {
      sVar2 = (this->
              super_ArrayRef<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>
              ).m_count;
      (local_28.m_p)->m_count = sVar2;
      pHVar6 = local_28.m_p + 1;
      if (sVar2 != 0) {
        pRVar4 = (this->
                 super_ArrayRef<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>
                 ).m_p;
        for (pHVar5 = pHVar6;
            pHVar5 < (Hdr *)(&(pHVar6->super_BufHdr).super_RefCount._vptr_RefCount + sVar2 * 2);
            pHVar5 = (Hdr *)&(pHVar5->super_BufHdr).super_RefCount.m_refCount) {
          pFVar1 = (FreeFunc *)pRVar4->m_originalRet;
          (pHVar5->super_BufHdr).super_RefCount._vptr_RefCount = (_func_int **)pRVar4->m_context;
          (pHVar5->super_BufHdr).super_RefCount.m_freeFunc = pFVar1;
          pRVar4 = pRVar4 + 1;
        }
      }
      pHVar5 = (this->
               super_ArrayRef<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>
               ).m_hdr;
      if (pHVar5 != (Hdr *)0x0) {
        rc::RefCount::release((RefCount *)pHVar5);
      }
      pHVar3 = local_28.m_p;
      (this->
      super_ArrayRef<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>
      ).m_p = (Ret *)pHVar6;
      local_28.m_p = (Hdr *)0x0;
      local_28.m_refCount = (RefCount *)0x0;
      (this->
      super_ArrayRef<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>
      ).m_hdr = pHVar3;
    }
    rc::Ptr<axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>::Hdr>::~Ptr(&local_28);
  }
  return bVar7;
}

Assistant:

bool
	reserve(size_t count) {
		size_t size = count * sizeof(T);

		if (this->m_hdr &&
			this->m_hdr->getRefCount() == 1 &&
			this->m_hdr->m_bufferSize >= size)
			return true;

		size_t bufferSize = getAllocSize(size);

		rc::Ptr<Hdr> hdr = AXL_RC_NEW_ARGS_EXTRA(Hdr, (bufferSize), bufferSize);
		if (!hdr)
			return false;

		Details::setHdrCount(hdr, this->m_count);

		T* p = (T*)(hdr + 1);

		if (this->m_count)
			Details::constructCopy(p, this->m_p, this->m_count);

		if (this->m_hdr)
			this->m_hdr->release();

		this->m_p = p;
		this->m_hdr = hdr.detach();
		return true;
	}